

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::push
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this,HeapType item)

{
  iterator __position;
  const_iterator cVar1;
  key_type local_18;
  HeapType item_local;
  
  local_18.id = item.id;
  cVar1 = std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->finished)._M_h,&local_18);
  if (cVar1.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
    __position._M_current =
         (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)this,__position,&local_18)
      ;
    }
    else {
      (__position._M_current)->id = local_18.id;
      (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void push(T item) {
    if (finished.count(item)) {
      return;
    }
    workStack.push_back(item);
  }